

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O1

Statement * __thiscall SQCompilation::SQParser::parseStatement(SQParser *this,bool closeframe)

{
  long lVar1;
  SQInteger SVar2;
  SQUnsignedInteger SVar3;
  long lVar4;
  BigChunk *pBVar5;
  bool global;
  SwitchStatement *pSVar6;
  Arena *pAVar7;
  Chunk *pCVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  if (500 < this->_depth) {
    reportDiagnostic(this,0x1d);
  }
  this->_depth = this->_depth + 1;
  lVar1 = this->_token;
  iVar11 = (int)(this->_lex)._tokenline;
  iVar10 = (int)(this->_lex)._tokencolumn;
  if (0x132 < lVar1) {
    global = false;
    switch(lVar1) {
    case 0x143:
switchD_00161623_caseD_143:
      pSVar6 = (SwitchStatement *)parseEnumStatement(this,global);
      break;
    case 0x144:
switchD_00161623_caseD_144:
      pSVar6 = (SwitchStatement *)parseConstStatement(this,global);
      break;
    case 0x145:
    case 0x146:
    case 0x147:
    case 0x148:
    case 0x149:
    case 0x14a:
switchD_00161589_caseD_10d:
      pAVar7 = (Arena *)Expression(this,SQE_REGULAR);
      pCVar8 = Arena::findChunk(this->_astArena,0x28);
      pSVar6 = (SwitchStatement *)pCVar8->_ptr;
      pCVar8->_ptr = (uint8_t *)&pSVar6->_cases;
      (pSVar6->super_Statement).super_Node._op = TO_EXPR_STMT;
      (pSVar6->super_Statement).super_Node._coordinates.lineStart = -1;
      (pSVar6->super_Statement).super_Node._coordinates.columnStart = -1;
      (pSVar6->super_Statement).super_Node._coordinates.lineEnd = -1;
      (pSVar6->super_Statement).super_Node._coordinates.columnEnd = -1;
      (((Node *)&(pSVar6->super_Statement).super_Node.super_ArenaObj)->super_ArenaObj).
      _vptr_ArenaObj = (_func_int **)&PTR__ArenaObj_001a48c8;
      ((ArenaVector<SQCompilation::EnumConst> *)&pSVar6->_expr)->_arena = pAVar7;
      pBVar5 = pAVar7->_bigChunks;
      *(SQAllocContext *)&(pSVar6->super_Statement).super_Node._coordinates = pAVar7->_alloc_ctx;
      *(BigChunk **)&(pSVar6->super_Statement).super_Node._coordinates.lineEnd = pBVar5;
      goto LAB_00161979;
    case 0x14b:
      Lex(this);
      global = true;
      if (this->_token == 0x143) goto switchD_00161623_caseD_143;
      if (this->_token == 0x144) goto switchD_00161623_caseD_144;
      pSVar6 = (SwitchStatement *)0x0;
      reportDiagnostic(this,0x17);
      break;
    case 0x14c:
      pSVar6 = (SwitchStatement *)parseDirectiveStatement(this);
      break;
    default:
      if (lVar1 != 0x133) {
        if (lVar1 == 0x150) goto switchD_00161589_caseD_11b;
        goto switchD_00161589_caseD_10d;
      }
      pSVar6 = (SwitchStatement *)parseLocalClassDeclStmt(this,false);
    }
    goto LAB_0016195d;
  }
  switch(lVar1) {
  case 0x10c:
    pSVar6 = parseSwitchStatement(this);
    break;
  case 0x10d:
  case 0x10e:
  case 0x10f:
  case 0x111:
  case 0x116:
  case 0x118:
  case 0x119:
  case 0x11a:
  case 0x11c:
  case 0x11f:
  case 0x120:
  case 0x121:
  case 0x122:
  case 0x126:
    goto switchD_00161589_caseD_10d;
  case 0x110:
    pSVar6 = (SwitchStatement *)parseIfStatement(this);
    break;
  case 0x112:
    pSVar6 = (SwitchStatement *)parseWhileStatement(this);
    break;
  case 0x113:
    pCVar8 = Arena::findChunk(this->_astArena,0x28);
    pSVar6 = (SwitchStatement *)pCVar8->_ptr;
    pCVar8->_ptr = (uint8_t *)&pSVar6->_cases;
    (pSVar6->super_Statement).super_Node._op = TO_BREAK;
    (pSVar6->super_Statement).super_Node._coordinates.lineStart = -1;
    (pSVar6->super_Statement).super_Node._coordinates.columnStart = -1;
    (pSVar6->super_Statement).super_Node._coordinates.lineEnd = -1;
    (pSVar6->super_Statement).super_Node._coordinates.columnEnd = -1;
    (((Node *)&(pSVar6->super_Statement).super_Node.super_ArenaObj)->super_ArenaObj)._vptr_ArenaObj
         = (_func_int **)&PTR__ArenaObj_001a4808;
    ((ArenaVector<SQCompilation::EnumConst> *)&pSVar6->_expr)->_arena = (Arena *)0x0;
    (pSVar6->super_Statement).super_Node._coordinates.lineStart = iVar11;
    (pSVar6->super_Statement).super_Node._coordinates.columnStart = iVar10;
    (pSVar6->super_Statement).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (pSVar6->super_Statement).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    Lex(this);
    goto LAB_00161979;
  case 0x114:
    pSVar6 = (SwitchStatement *)parseForStatement(this);
    break;
  case 0x115:
    pSVar6 = (SwitchStatement *)parseDoWhileStatement(this);
    break;
  case 0x117:
    pSVar6 = (SwitchStatement *)parseForEachStatement(this);
    break;
  case 0x11b:
switchD_00161589_caseD_11b:
    pSVar6 = (SwitchStatement *)parseLocalDeclStatement(this);
    break;
  case 0x11d:
    pSVar6 = (SwitchStatement *)parseLocalFunctionDeclStmt(this,false);
    break;
  case 0x11e:
  case 0x124:
    SVar2 = (this->_lex)._currentline;
    iVar9 = (int)(this->_lex)._currentcolumn;
    Lex(this);
    if ((this->_lex)._prevtoken == 10) {
      pAVar7 = (Arena *)0x0;
    }
    else {
      lVar4 = this->_token;
      pAVar7 = (Arena *)0x0;
      if (lVar4 < 0x7d) {
        pAVar7 = (Arena *)0x0;
        if ((lVar4 != 0) && (lVar4 != 0x3b)) {
LAB_001619f9:
          pAVar7 = (Arena *)Expression(this,SQE_RVALUE);
        }
      }
      else if ((lVar4 != 0x7d) && (lVar4 != 0x14c)) goto LAB_001619f9;
    }
    if (lVar1 == 0x11e) {
      pCVar8 = Arena::findChunk(this->_astArena,0x30);
      pSVar6 = (SwitchStatement *)pCVar8->_ptr;
      pCVar8->_ptr = (uint8_t *)&(pSVar6->_cases)._vals;
      (pSVar6->super_Statement).super_Node._op = TO_RETURN;
      (pSVar6->super_Statement).super_Node._coordinates.lineStart = -1;
      (pSVar6->super_Statement).super_Node._coordinates.columnStart = -1;
      (pSVar6->super_Statement).super_Node._coordinates.lineEnd = -1;
      (pSVar6->super_Statement).super_Node._coordinates.columnEnd = -1;
      ((ArenaVector<SQCompilation::EnumConst> *)&pSVar6->_expr)->_arena = pAVar7;
      (((Node *)&(pSVar6->super_Statement).super_Node.super_ArenaObj)->super_ArenaObj).
      _vptr_ArenaObj = (_func_int **)&PTR__ArenaObj_001a46f0;
      *(undefined1 *)&(pSVar6->_cases)._arena = 0;
    }
    else {
      pCVar8 = Arena::findChunk(this->_astArena,0x28);
      pSVar6 = (SwitchStatement *)pCVar8->_ptr;
      pCVar8->_ptr = (uint8_t *)&pSVar6->_cases;
      (pSVar6->super_Statement).super_Node._op = TO_YIELD;
      (pSVar6->super_Statement).super_Node._coordinates.lineStart = -1;
      (pSVar6->super_Statement).super_Node._coordinates.columnStart = -1;
      (pSVar6->super_Statement).super_Node._coordinates.lineEnd = -1;
      (pSVar6->super_Statement).super_Node._coordinates.columnEnd = -1;
      ((ArenaVector<SQCompilation::EnumConst> *)&pSVar6->_expr)->_arena = pAVar7;
      (((Node *)&(pSVar6->super_Statement).super_Node.super_ArenaObj)->super_ArenaObj).
      _vptr_ArenaObj = (_func_int **)&PTR__ArenaObj_001a4760;
    }
    if (pAVar7 == (Arena *)0x0) {
      (pSVar6->super_Statement).super_Node._coordinates.lineEnd = (int)SVar2;
    }
    else {
      *(SQAllocContext *)&(pSVar6->super_Statement).super_Node._coordinates = pAVar7->_alloc_ctx;
      (pSVar6->super_Statement).super_Node._coordinates.lineEnd = *(int *)&pAVar7->_bigChunks;
      iVar9 = *(int *)((long)&pAVar7->_bigChunks + 4);
    }
    (pSVar6->super_Statement).super_Node._coordinates.columnEnd = iVar9;
    goto LAB_001619d9;
  case 0x123:
    pCVar8 = Arena::findChunk(this->_astArena,0x28);
    pSVar6 = (SwitchStatement *)pCVar8->_ptr;
    pCVar8->_ptr = (uint8_t *)&pSVar6->_cases;
    (pSVar6->super_Statement).super_Node._op = TO_CONTINUE;
    (pSVar6->super_Statement).super_Node._coordinates.lineStart = -1;
    (pSVar6->super_Statement).super_Node._coordinates.columnStart = -1;
    (pSVar6->super_Statement).super_Node._coordinates.lineEnd = -1;
    (pSVar6->super_Statement).super_Node._coordinates.columnEnd = -1;
    (((Node *)&(pSVar6->super_Statement).super_Node.super_ArenaObj)->super_ArenaObj)._vptr_ArenaObj
         = (_func_int **)&PTR__ArenaObj_001a4858;
    ((ArenaVector<SQCompilation::EnumConst> *)&pSVar6->_expr)->_arena = (Arena *)0x0;
    (pSVar6->super_Statement).super_Node._coordinates.lineStart = iVar11;
    (pSVar6->super_Statement).super_Node._coordinates.columnStart = iVar10;
    (pSVar6->super_Statement).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (pSVar6->super_Statement).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    Lex(this);
    goto LAB_00161979;
  case 0x125:
    pSVar6 = (SwitchStatement *)parseTryCatchStatement(this);
    break;
  case 0x127:
    Lex(this);
    pAVar7 = (Arena *)Expression(this,SQE_RVALUE);
    pCVar8 = Arena::findChunk(this->_astArena,0x28);
    pSVar6 = (SwitchStatement *)pCVar8->_ptr;
    pCVar8->_ptr = (uint8_t *)&pSVar6->_cases;
    (pSVar6->super_Statement).super_Node._op = TO_THROW;
    (pSVar6->super_Statement).super_Node._coordinates.lineStart = -1;
    (pSVar6->super_Statement).super_Node._coordinates.columnStart = -1;
    (pSVar6->super_Statement).super_Node._coordinates.lineEnd = -1;
    (pSVar6->super_Statement).super_Node._coordinates.columnEnd = -1;
    ((ArenaVector<SQCompilation::EnumConst> *)&pSVar6->_expr)->_arena = pAVar7;
    (((Node *)&(pSVar6->super_Statement).super_Node.super_ArenaObj)->super_ArenaObj)._vptr_ArenaObj
         = (_func_int **)&PTR__ArenaObj_001a4798;
    pBVar5 = pAVar7->_bigChunks;
    *(SQAllocContext *)&(pSVar6->super_Statement).super_Node._coordinates = pAVar7->_alloc_ctx;
    *(BigChunk **)&(pSVar6->super_Statement).super_Node._coordinates.lineEnd = pBVar5;
LAB_001619d9:
    (pSVar6->super_Statement).super_Node._coordinates.lineStart = iVar11;
    (pSVar6->super_Statement).super_Node._coordinates.columnStart = iVar10;
    goto LAB_00161979;
  default:
    if (lVar1 == 0x3b) {
      pCVar8 = Arena::findChunk(this->_astArena,0x20);
      pSVar6 = (SwitchStatement *)pCVar8->_ptr;
      pCVar8->_ptr = (uint8_t *)&pSVar6->_expr;
      (pSVar6->super_Statement).super_Node._op = TO_EMPTY;
      (pSVar6->super_Statement).super_Node._coordinates.lineStart = -1;
      (pSVar6->super_Statement).super_Node._coordinates.columnStart = -1;
      (pSVar6->super_Statement).super_Node._coordinates.lineEnd = -1;
      (pSVar6->super_Statement).super_Node._coordinates.columnEnd = -1;
      (((Node *)&(pSVar6->super_Statement).super_Node.super_ArenaObj)->super_ArenaObj).
      _vptr_ArenaObj = (_func_int **)&PTR__ArenaObj_001a4890;
      Lex(this);
    }
    else {
      if (lVar1 != 0x7b) goto switchD_00161589_caseD_10d;
      SVar3 = this->_lang_features;
      Lex(this);
      pSVar6 = (SwitchStatement *)parseStatements(this);
      Expect(this,0x7d);
      this->_lang_features = SVar3;
    }
  }
LAB_0016195d:
  (pSVar6->super_Statement).super_Node._coordinates.lineStart = iVar11;
  (pSVar6->super_Statement).super_Node._coordinates.columnStart = iVar10;
  (pSVar6->super_Statement).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
  (pSVar6->super_Statement).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
LAB_00161979:
  this->_depth = this->_depth - 1;
  return &pSVar6->super_Statement;
}

Assistant:

Statement* SQParser::parseStatement(bool closeframe)
{
    NestingChecker nc(this);
    Statement *result = NULL;
    SQInteger l = line(), c = column();

    switch(_token) {
    case _SC(';'):  result = newNode<EmptyStatement>(); Lex(); break;
    case TK_DIRECTIVE:  result = parseDirectiveStatement();    break;
    case TK_IF:     result = parseIfStatement();          break;
    case TK_WHILE:  result = parseWhileStatement();       break;
    case TK_DO:     result = parseDoWhileStatement();     break;
    case TK_FOR:    result = parseForStatement();         break;
    case TK_FOREACH:result = parseForEachStatement();     break;
    case TK_SWITCH: result = parseSwitchStatement();      break;
    case TK_LOCAL:
    case TK_LET:
        result = parseLocalDeclStatement();
        break;
    case TK_RETURN:
    case TK_YIELD: {
        SQOpcode op;
        if(_token == TK_RETURN) {
            op = _OP_RETURN;
        }
        else {
            op = _OP_YIELD;
        }
        SQInteger le = _lex._currentline;
        SQInteger ce = _lex._currentcolumn;
        Lex();

        Expr *arg = NULL;
        if(!IsEndOfStatement()) {
            arg = Expression(SQE_RVALUE);
        }

        result = op == _OP_RETURN ? static_cast<TerminateStatement *>(newNode<ReturnStatement>(arg)) : newNode<YieldStatement>(arg);
        if (arg) {
            copyCoordinates(arg, result);
        }
        else {
            result->setLineEndPos(le);
            result->setColumnEndPos(ce);
        }

        result->setLineStartPos(l);
        result->setColumnStartPos(c);

        return result;
    }
    case TK_BREAK:
        result = setCoordinates(newNode<BreakStatement>(nullptr), l, c);
        Lex();
        return result;
    case TK_CONTINUE:
        result = setCoordinates(newNode<ContinueStatement>(nullptr), l, c);
        Lex();
        return result;
    case TK_FUNCTION:
        result = parseLocalFunctionDeclStmt(false);
        break;
    case TK_CLASS:
        result = parseLocalClassDeclStmt(false);
        break;
    case TK_ENUM:
        result = parseEnumStatement(false);
        break;
    case _SC('{'):
    {
        SQUnsignedInteger savedLangFeatures = _lang_features;
        Lex();
        result = parseStatements();
        Expect(_SC('}'));
        _lang_features = savedLangFeatures;
        break;
    }
    case TK_TRY:
        result = parseTryCatchStatement();
        break;
    case TK_THROW: {
        Lex();
        Expr *e = Expression(SQE_RVALUE);
        result = copyCoordinates(e, newNode<ThrowStatement>(e));
        result->setLineStartPos(l); result->setColumnStartPos(c);
        return result;
    }
    case TK_CONST:
        result = parseConstStatement(false);
        break;
    case TK_GLOBAL:
        Lex();
        if (_token == TK_CONST)
            result = parseConstStatement(true);
        else if (_token == TK_ENUM)
            result = parseEnumStatement(true);
        else
            reportDiagnostic(DiagnosticsId::DI_GLOBAL_CONSTS_ONLY);
        break;
    default: {
        Expr *e = Expression(SQE_REGULAR);
        return copyCoordinates(e, newNode<ExprStatement>(e));
      }
    }

    setCoordinates(result, l, c);

    assert(result);
    return result;
}